

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

HeapType __thiscall
wasm::Random::pick<wasm::HeapType>(Random *this,FeatureOptions<wasm::HeapType> *picker)

{
  uintptr_t uVar1;
  value_type *pvVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_30;
  
  items<wasm::HeapType>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>(this,&local_30);
  uVar1 = pvVar2->id;
  if (local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (HeapType)uVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }